

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directional_light.h
# Opt level: O0

void __thiscall
CGL::GLScene::DirectionalLight::DirectionalLight
          (DirectionalLight *this,LightInfo *light_info,Matrix4x4 *transform)

{
  ostream *poVar1;
  void *this_00;
  long in_RSI;
  SceneLight *in_RDI;
  Vector4D *in_stack_00000010;
  Matrix4x4 *in_stack_00000018;
  Vector4D *in_stack_ffffffffffffff08;
  Vector3D *in_stack_ffffffffffffff28;
  _func_int **local_d0;
  _func_int **local_c8;
  _func_int **local_c0;
  Vector3D local_b8;
  Vector4D local_98 [3];
  _func_int **local_38;
  _func_int **local_30;
  _func_int **local_28;
  _func_int **local_20;
  long local_10;
  
  local_10 = in_RSI;
  SceneLight::SceneLight(in_RDI);
  in_RDI->_vptr_SceneLight = (_func_int **)&PTR_get_static_light_00398970;
  Vector3D::Vector3D((Vector3D *)(in_RDI + 2));
  Vector3D::Vector3D((Vector3D *)(in_RDI + 6));
  Vector3D::Vector3D((Vector3D *)(in_RDI + 10));
  in_RDI[2]._vptr_SceneLight = *(_func_int ***)(local_10 + 0x50);
  in_RDI[3]._vptr_SceneLight = *(_func_int ***)(local_10 + 0x58);
  in_RDI[4]._vptr_SceneLight = *(_func_int ***)(local_10 + 0x60);
  in_RDI[5]._vptr_SceneLight = *(_func_int ***)(local_10 + 0x68);
  Vector4D::Vector4D(local_98,(Vector3D *)(local_10 + 0x90),1.0);
  Matrix4x4::operator*(in_stack_00000018,in_stack_00000010);
  Vector4D::to3D(in_stack_ffffffffffffff08);
  Vector3D::operator-((Vector3D *)in_stack_ffffffffffffff08);
  in_RDI[10]._vptr_SceneLight = local_38;
  in_RDI[0xb]._vptr_SceneLight = local_30;
  in_RDI[0xc]._vptr_SceneLight = local_28;
  in_RDI[0xd]._vptr_SceneLight = local_20;
  poVar1 = std::operator<<((ostream *)&std::cout,"found directional light with position ");
  Vector3D::operator-((Vector3D *)in_stack_ffffffffffffff08);
  poVar1 = (ostream *)CGL::operator<<(poVar1,&local_b8);
  poVar1 = std::operator<<(poVar1," and spec ");
  this_00 = (void *)CGL::operator<<(poVar1,(Vector3D *)(in_RDI + 2));
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  Vector3D::unit(in_stack_ffffffffffffff28);
  in_RDI[6]._vptr_SceneLight = (_func_int **)in_stack_ffffffffffffff28;
  in_RDI[7]._vptr_SceneLight = local_d0;
  in_RDI[8]._vptr_SceneLight = local_c8;
  in_RDI[9]._vptr_SceneLight = local_c0;
  return;
}

Assistant:

DirectionalLight(const Collada::LightInfo& light_info, 
                   const Matrix4x4& transform) {
    this->spectrum = light_info.spectrum;
//    this->direction = -(transform * Vector4D(light_info.direction, 1)).to3D();
//    this->direction.normalize();
    // Begin -- Lens Flare
    this->position = -(transform * Vector4D(light_info.direction, 1)).to3D();
    std::cout << "found directional light with position " << -this->position << " and spec " << this->spectrum << std::endl;
    this->direction = (this->position).unit();
    // End -- Lens Flare

  }